

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int entropy_update(mbedtls_entropy_context *ctx,uchar source_id,uchar *data,size_t len)

{
  int local_8c;
  size_t *psStack_88;
  int ret;
  uchar *p;
  size_t use_len;
  uchar tmp [64];
  uchar local_2a;
  undefined1 local_29;
  size_t sStack_28;
  uchar header [2];
  size_t len_local;
  uchar *data_local;
  uchar source_id_local;
  mbedtls_entropy_context *ctx_local;
  
  psStack_88 = (size_t *)data;
  p = (uchar *)len;
  sStack_28 = len;
  if (0x40 < len) {
    local_8c = mbedtls_sha512_ret(data,len,(uchar *)&use_len,0);
    if (local_8c != 0) goto LAB_001492f1;
    psStack_88 = &use_len;
    p = (uchar *)0x40;
  }
  local_29 = SUB81(p,0);
  local_2a = source_id;
  if ((ctx->accumulator_started != 0) ||
     (local_8c = mbedtls_sha512_starts_ret(&ctx->accumulator,0), local_8c == 0)) {
    ctx->accumulator_started = 1;
    local_8c = mbedtls_sha512_update_ret(&ctx->accumulator,&local_2a,2);
    if (local_8c == 0) {
      local_8c = mbedtls_sha512_update_ret(&ctx->accumulator,(uchar *)psStack_88,(size_t)p);
    }
  }
LAB_001492f1:
  mbedtls_platform_zeroize(&use_len,0x40);
  return local_8c;
}

Assistant:

static int entropy_update( mbedtls_entropy_context *ctx, unsigned char source_id,
                           const unsigned char *data, size_t len )
{
    unsigned char header[2];
    unsigned char tmp[MBEDTLS_ENTROPY_BLOCK_SIZE];
    size_t use_len = len;
    const unsigned char *p = data;
    int ret = 0;

    if( use_len > MBEDTLS_ENTROPY_BLOCK_SIZE )
    {
#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
        if( ( ret = mbedtls_sha512_ret( data, len, tmp, 0 ) ) != 0 )
            goto cleanup;
#else
        if( ( ret = mbedtls_sha256_ret( data, len, tmp, 0 ) ) != 0 )
            goto cleanup;
#endif
        p = tmp;
        use_len = MBEDTLS_ENTROPY_BLOCK_SIZE;
    }

    header[0] = source_id;
    header[1] = use_len & 0xFF;

    /*
     * Start the accumulator if this has not already happened. Note that
     * it is sufficient to start the accumulator here only because all calls to
     * gather entropy eventually execute this code.
     */
#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    if( ctx->accumulator_started == 0 &&
        ( ret = mbedtls_sha512_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto cleanup;
    else
        ctx->accumulator_started = 1;
    if( ( ret = mbedtls_sha512_update_ret( &ctx->accumulator, header, 2 ) ) != 0 )
        goto cleanup;
    ret = mbedtls_sha512_update_ret( &ctx->accumulator, p, use_len );
#else
    if( ctx->accumulator_started == 0 &&
        ( ret = mbedtls_sha256_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto cleanup;
    else
        ctx->accumulator_started = 1;
    if( ( ret = mbedtls_sha256_update_ret( &ctx->accumulator, header, 2 ) ) != 0 )
        goto cleanup;
    ret = mbedtls_sha256_update_ret( &ctx->accumulator, p, use_len );
#endif

cleanup:
    mbedtls_platform_zeroize( tmp, sizeof( tmp ) );

    return( ret );
}